

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O2

void helper_gvec_sqsub_d_arm(void *vd,void *vq,void *vn,void *vm,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uintptr_t i;
  ulong uVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar1 = (desc & 0x1f) * 8 + 8;
  uVar4 = (ulong)uVar1;
  bVar5 = false;
  for (uVar7 = 0; uVar1 >> 3 != uVar7; uVar7 = uVar7 + 1) {
    uVar2 = *(ulong *)((long)vn + uVar7 * 8);
    uVar3 = *(ulong *)((long)vm + uVar7 * 8);
    uVar6 = uVar2 - uVar3;
    uVar8 = 0x8000000000000000;
    if (-1 < (long)uVar2) {
      uVar8 = 0x7fffffffffffffff;
    }
    bVar9 = (long)((uVar6 ^ uVar2) & (uVar3 ^ uVar2)) < 0;
    if (!bVar9) {
      uVar8 = uVar6;
    }
    bVar5 = (bool)(bVar5 | bVar9);
    *(ulong *)((long)vd + uVar7 * 8) = uVar8;
  }
  if (bVar5) {
    *(undefined4 *)vq = 1;
  }
  for (; uVar4 < (desc >> 2 & 0xf8) + 8; uVar4 = uVar4 + 8) {
    *(undefined8 *)((long)vd + uVar4) = 0;
  }
  return;
}

Assistant:

void HELPER(gvec_sqsub_d)(void *vd, void *vq, void *vn,
                          void *vm, uint32_t desc)
{
    intptr_t i, oprsz = simd_oprsz(desc);
    int64_t *d = vd, *n = vn, *m = vm;
    bool q = false;

    for (i = 0; i < oprsz / 8; i++) {
        int64_t nn = n[i], mm = m[i], dd = nn - mm;
        if (((dd ^ nn) & (nn ^ mm)) & INT64_MIN) {
            dd = (nn >> 63) ^ ~INT64_MIN;
            q = true;
        }
        d[i] = dd;
    }
    if (q) {
        uint32_t *qc = vq;
        qc[0] = 1;
    }
    clear_tail(d, oprsz, simd_maxsz(desc));
}